

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProcess.h
# Opt level: O0

void __thiscall Assimp::SharedPostProcessInfo::Clean(SharedPostProcessInfo *this)

{
  bool bVar1;
  reference ppVar2;
  _Self local_20;
  iterator end;
  iterator it;
  SharedPostProcessInfo *this_local;
  
  end = std::
        map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
        ::begin(&this->pmap);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
       ::end(&this->pmap);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>
             ::operator*(&end);
    if (ppVar2->second != (Base *)0x0) {
      (*ppVar2->second->_vptr_Base[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>::
    operator++(&end);
  }
  std::
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  ::clear(&this->pmap);
  return;
}

Assistant:

void Clean()
    {
        // invoke the virtual destructor for all stored properties
        for (PropertyMap::iterator it = pmap.begin(), end = pmap.end();
             it != end; ++it)
        {
            delete (*it).second;
        }
        pmap.clear();
    }